

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e10892::CloseButton::CloseButton(CloseButton *this,QWidget *parent)

{
  QSize *s;
  QAbstractButton *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  FocusPolicy in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  QCursor *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  CursorShape CVar1;
  QCursor *in_stack_ffffffffffffffb0;
  QString *s_00;
  QWidget *in_stack_ffffffffffffffd8;
  QCursor local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractButton::QAbstractButton(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1cee8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__CloseButton_00d1d0b0;
  CVar1 = ArrowCursor;
  QWidget::setFocusPolicy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  this_00 = &local_10;
  QCursor::QCursor(this_00,CVar1);
  QWidget::setCursor(in_RDI,in_stack_ffffffffffffffb0);
  QCursor::~QCursor(this_00);
  s_00 = (QString *)&stack0xffffffffffffffd8;
  tr((char *)CONCAT44(CVar1,in_stack_ffffffffffffffa8),(char *)this_00,in_stack_ffffffffffffff9c);
  QWidget::setToolTip(in_RDI,s_00);
  QString::~QString((QString *)0x6ad21b);
  s = (QSize *)(**(code **)(*(long *)in_RDI + 0x70))();
  QWidget::resize(in_stack_ffffffffffffffd8,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CloseButton::CloseButton(QWidget *parent)
    : QAbstractButton(parent)
{
    setFocusPolicy(Qt::NoFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
#if QT_CONFIG(tooltip)
    setToolTip(tr("Close Tab"));
#endif
    resize(sizeHint());
}